

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  ImGuiContext *pIVar1;
  int i_stop;
  int local_2c;
  ImGuiWindow *local_28;
  ImGuiWindow *window_target;
  int i_current;
  ImGuiContext *g;
  int focus_change_dir_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x2123,"void NavUpdateWindowingHighlightWindow(int)");
  }
  if ((GImGui->NavWindowingTarget->Flags & 0x8000000U) == 0) {
    i_stop = ImGui::FindWindowFocusIndex(GImGui->NavWindowingTarget);
    local_28 = FindWindowNavFocusable(i_stop + focus_change_dir,-0x7fffffff,focus_change_dir);
    if (local_28 == (ImGuiWindow *)0x0) {
      if (focus_change_dir < 0) {
        local_2c = (pIVar1->WindowsFocusOrder).Size + -1;
      }
      else {
        local_2c = 0;
      }
      local_28 = FindWindowNavFocusable(local_2c,i_stop,focus_change_dir);
    }
    if (local_28 != (ImGuiWindow *)0x0) {
      pIVar1->NavWindowingTargetAnim = local_28;
      pIVar1->NavWindowingTarget = local_28;
    }
    pIVar1->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
    g.NavWindowingToggleLayer = false;
}